

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

long SSL_get_verify_result(SSL *ssl)

{
  SSL_SESSION *pSVar1;
  long lVar2;
  
  bssl::check_ssl_x509_method((SSL *)ssl);
  pSVar1 = SSL_get_session(ssl);
  if (pSVar1 == (SSL_SESSION *)0x0) {
    lVar2 = 0x41;
  }
  else {
    lVar2 = *(long *)(pSVar1->krb5_client_princ + 0x30);
  }
  return lVar2;
}

Assistant:

long SSL_get_verify_result(const SSL *ssl) {
  check_ssl_x509_method(ssl);
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL) {
    return X509_V_ERR_INVALID_CALL;
  }
  return session->verify_result;
}